

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall Privkey_HasWif_hex_Test::~Privkey_HasWif_hex_Test(Privkey_HasWif_hex_Test *this)

{
  Privkey_HasWif_hex_Test *this_local;
  
  ~Privkey_HasWif_hex_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, HasWif_hex) {
  std::string hex = "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27";
  NetType net_type = NetType::kRegtest;
  bool is_compressed = false;
  bool has_wif = Privkey::HasWif(hex, &net_type, &is_compressed);
  EXPECT_FALSE(has_wif);
  EXPECT_FALSE(is_compressed);
}